

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::OptionsToInterpret::~OptionsToInterpret(OptionsToInterpret *this)

{
  OptionsToInterpret *this_local;
  
  std::__cxx11::string::~string((string *)&this->element_name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

OptionsToInterpret(const string& ns,
                     const string& el,
                     const Message* orig_opt,
                     Message* opt)
      : name_scope(ns),
        element_name(el),
        original_options(orig_opt),
        options(opt) {
  }